

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::DrawIndirect(DeviceContextVkImpl *this,DrawIndirectAttribs *Attribs)

{
  Uint32 *pUVar1;
  RESOURCE_STATE_TRANSITION_MODE TransitionMode;
  BufferVkImpl *pBuffer;
  IBuffer *pIVar2;
  VkBuffer_T *pVVar3;
  pointer pMVar4;
  Uint64 UVar5;
  BufferVkImpl *this_00;
  VkBuffer Buffer;
  VkBuffer CountBuffer;
  ulong uVar6;
  size_t sVar7;
  char (*in_R8) [34];
  size_t sVar8;
  ulong uVar9;
  VulkanCommandBuffer *pVVar10;
  Uint32 Stride;
  string local_58;
  VulkanCommandBuffer *local_38;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::DrawIndirect
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  this_00 = PrepareIndirectAttribsBuffer
                      (this,Attribs->pAttribsBuffer,Attribs->AttribsBufferStateTransitionMode,
                       "Indirect draw (DeviceContextVkImpl::DrawIndirect)");
  pBuffer = (BufferVkImpl *)Attribs->pCounterBuffer;
  if (pBuffer != (BufferVkImpl *)0x0) {
    TransitionMode = Attribs->CounterBufferStateTransitionMode;
    CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)pBuffer);
    if ((pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
        .m_Desc.Usage == USAGE_DYNAMIC) {
      DvpVerifyDynamicAllocation(this,pBuffer);
    }
    in_R8 = (char (*) [34])0x1;
    TransitionOrVerifyBufferState
              (this,pBuffer,TransitionMode,RESOURCE_STATE_INDIRECT_ARGUMENT,
               VK_ACCESS_INDIRECT_COMMAND_READ_BIT,
               "Count buffer (DeviceContextVkImpl::DrawIndirect)");
  }
  PrepareForDraw(this,Attribs->Flags);
  if (Attribs->DrawCount == 0) goto LAB_0028832a;
  pIVar2 = Attribs->pCounterBuffer;
  pVVar10 = &this->m_CommandBuffer;
  Buffer = BufferVkImpl::GetVkBuffer(this_00);
  pVVar3 = (this_00->m_VulkanBuffer).m_VkObject;
  if (pIVar2 == (IBuffer *)0x0) {
    Stride = 0;
    if (pVVar3 == (VkBuffer_T *)0x0) {
      DvpVerifyDynamicAllocation(this,this_00);
      uVar9 = (ulong)(this_00->super_BufferBase<Diligent::EngineVkImplTraits>).m_DynamicBufferId;
      if (uVar9 == 0xffffffff) {
        FormatString<char[17],char_const*,char[34]>
                  (&local_58,(Diligent *)"Dynamic buffer \'",
                   (char (*) [17])
                   &(this_00->super_BufferBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                    .m_Desc,(char **)"\' does not have dynamic buffer ID",in_R8);
        DebugAssertionFailed
                  (local_58._M_dataplus._M_p,"GetDynamicBufferOffset",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
                   ,0x2a2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      pMVar4 = (this->m_MappedBuffers).
               super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->m_MappedBuffers).
                     super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 3) *
              -0x3333333333333333;
      if (uVar6 < uVar9 || uVar6 - uVar9 == 0) {
        sVar7 = 0;
      }
      else {
        sVar7 = pMVar4[uVar9].Allocation.AlignedOffset;
      }
    }
    else {
      sVar7 = 0;
    }
    if (1 < Attribs->DrawCount) {
      Stride = Attribs->DrawArgsStride;
    }
    VulkanUtilities::VulkanCommandBuffer::DrawIndirect
              (pVVar10,Buffer,sVar7 + Attribs->DrawArgsOffset,Attribs->DrawCount,Stride);
    goto LAB_0028832a;
  }
  if (pVVar3 == (VkBuffer_T *)0x0) {
    DvpVerifyDynamicAllocation(this,this_00);
    uVar9 = (ulong)(this_00->super_BufferBase<Diligent::EngineVkImplTraits>).m_DynamicBufferId;
    if (uVar9 == 0xffffffff) {
      FormatString<char[17],char_const*,char[34]>
                (&local_58,(Diligent *)"Dynamic buffer \'",
                 (char (*) [17])
                 &(this_00->super_BufferBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  .m_Desc,(char **)"\' does not have dynamic buffer ID",in_R8);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"GetDynamicBufferOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
                 ,0x2a2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    pMVar4 = (this->m_MappedBuffers).
             super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->m_MappedBuffers).
                   super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 3) *
            -0x3333333333333333;
    if (uVar6 < uVar9 || uVar6 - uVar9 == 0) goto LAB_00288143;
    sVar7 = pMVar4[uVar9].Allocation.AlignedOffset;
  }
  else {
LAB_00288143:
    sVar7 = 0;
  }
  UVar5 = Attribs->DrawArgsOffset;
  CountBuffer = BufferVkImpl::GetVkBuffer(pBuffer);
  if ((pBuffer->m_VulkanBuffer).m_VkObject == (VkBuffer_T *)0x0) {
    local_38 = pVVar10;
    DvpVerifyDynamicAllocation(this,pBuffer);
    uVar9 = (ulong)(pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).m_DynamicBufferId;
    if (uVar9 == 0xffffffff) {
      FormatString<char[17],char_const*,char[34]>
                (&local_58,(Diligent *)"Dynamic buffer \'",
                 (char (*) [17])
                 &(pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  .m_Desc,(char **)"\' does not have dynamic buffer ID",in_R8);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"GetDynamicBufferOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
                 ,0x2a2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    pMVar4 = (this->m_MappedBuffers).
             super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->m_MappedBuffers).
                   super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 3) *
            -0x3333333333333333;
    pVVar10 = local_38;
    if (uVar6 < uVar9 || uVar6 - uVar9 == 0) {
      sVar8 = 0;
    }
    else {
      sVar8 = pMVar4[uVar9].Allocation.AlignedOffset;
    }
  }
  else {
    sVar8 = 0;
  }
  VulkanUtilities::VulkanCommandBuffer::DrawIndirectCount
            (pVVar10,Buffer,sVar7 + UVar5,CountBuffer,sVar8 + Attribs->CounterOffset,
             Attribs->DrawCount,Attribs->DrawArgsStride);
LAB_0028832a:
  pUVar1 = &(this->m_State).NumCommands;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::DrawIndirect(const DrawIndirectAttribs& Attribs)
{
    TDeviceContextBase::DrawIndirect(Attribs, 0);

    // We must prepare indirect draw attribs buffer first because state transitions must
    // be performed outside of render pass, and PrepareForDraw commits render pass
    BufferVkImpl* pIndirectDrawAttribsVk = PrepareIndirectAttribsBuffer(Attribs.pAttribsBuffer, Attribs.AttribsBufferStateTransitionMode, "Indirect draw (DeviceContextVkImpl::DrawIndirect)");
    BufferVkImpl* pCountBufferVk         = Attribs.pCounterBuffer != nullptr ?
        PrepareIndirectAttribsBuffer(Attribs.pCounterBuffer, Attribs.CounterBufferStateTransitionMode, "Count buffer (DeviceContextVkImpl::DrawIndirect)") :
        nullptr;

    PrepareForDraw(Attribs.Flags);

    if (Attribs.DrawCount > 0)
    {
        if (Attribs.pCounterBuffer == nullptr)
        {
            m_CommandBuffer.DrawIndirect(pIndirectDrawAttribsVk->GetVkBuffer(),
                                         GetDynamicBufferOffset(pIndirectDrawAttribsVk) + Attribs.DrawArgsOffset,
                                         Attribs.DrawCount, Attribs.DrawCount > 1 ? Attribs.DrawArgsStride : 0);
        }
        else
        {
            m_CommandBuffer.DrawIndirectCount(pIndirectDrawAttribsVk->GetVkBuffer(),
                                              GetDynamicBufferOffset(pIndirectDrawAttribsVk) + Attribs.DrawArgsOffset,
                                              pCountBufferVk->GetVkBuffer(),
                                              GetDynamicBufferOffset(pCountBufferVk) + Attribs.CounterOffset,
                                              Attribs.DrawCount,
                                              Attribs.DrawArgsStride);
        }
    }

    ++m_State.NumCommands;
}